

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpnghandler.cpp
# Opt level: O3

bool __thiscall QPngHandler::supportsOption(QPngHandler *this,ImageOption option)

{
  return (bool)((byte)(0x40e5 >> ((byte)option & 0x1f)) & option < SupportedSubTypes);
}

Assistant:

bool QPngHandler::supportsOption(ImageOption option) const
{
    return option == Gamma
        || option == Description
        || option == ImageFormat
        || option == Quality
        || option == CompressionRatio
        || option == Size;
}